

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easing.cpp
# Opt level: O0

qreal easeInElastic_helper(qreal t,qreal b,qreal c,qreal d,qreal a,qreal p)

{
  double in_XMM0_Qa;
  double dVar1;
  __type_conflict3 _Var2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  qreal s;
  qreal t_adj;
  undefined8 in_stack_ffffffffffffffa0;
  float x;
  undefined8 local_30;
  undefined8 local_8;
  
  x = (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if ((in_XMM0_Qa != 0.0) || (local_8 = in_XMM1_Qa, NAN(in_XMM0_Qa))) {
    if ((in_XMM0_Qa / in_XMM3_Qa != 1.0) || (NAN(in_XMM0_Qa / in_XMM3_Qa))) {
      dVar1 = qFabs<double>(in_XMM2_Qa);
      local_30 = in_XMM2_Qa;
      if (dVar1 <= in_XMM4_Qa) {
        qAsin<double>(3.66143403984146e-317);
        local_30 = in_XMM4_Qa;
      }
      _Var2 = qPow<float,double>(x,local_30);
      local_30 = local_30 * _Var2;
      dVar1 = qSin<double>(3.66151852506689e-317);
      local_8 = -local_30 * dVar1 + in_XMM1_Qa;
    }
    else {
      local_8 = in_XMM1_Qa + in_XMM2_Qa;
    }
  }
  return local_8;
}

Assistant:

static qreal easeInElastic_helper(qreal t, qreal b, qreal c, qreal d, qreal a, qreal p)
{
    if (t==0) return b;
    qreal t_adj = (qreal)t / (qreal)d;
    if (t_adj==1) return b+c;

    qreal s;
    if(a < ::qFabs(c)) {
        a = c;
        s = p / 4.0f;
    } else {
        s = p / (2 * M_PI) * ::qAsin(c / a);
    }

    t_adj -= 1.0f;
    return -(a*::qPow(2.0f,10*t_adj) * ::qSin( (t_adj*d-s)*(2*M_PI)/p )) + b;
}